

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O0

int Ivy_ManResetLevels_rec(Ivy_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  Ivy_Obj_t *pIVar3;
  Ivy_Obj_t *pObj_local;
  
  if (((*(uint *)&pObj->field_0x8 >> 0xb != 0) || (iVar1 = Ivy_ObjIsCi(pObj), iVar1 != 0)) ||
     (iVar1 = Ivy_ObjIsConst1(pObj), iVar1 != 0)) {
    return *(uint *)&pObj->field_0x8 >> 0xb;
  }
  iVar1 = Ivy_ObjIsBuf(pObj);
  if (iVar1 != 0) {
    pIVar3 = Ivy_ObjFanin0(pObj);
    uVar2 = Ivy_ManResetLevels_rec(pIVar3);
    *(uint *)&pObj->field_0x8 = *(uint *)&pObj->field_0x8 & 0x7ff | (uVar2 & 0x1fffff) << 0xb;
    return uVar2 & 0x1fffff;
  }
  iVar1 = Ivy_ObjIsNode(pObj);
  if (iVar1 != 0) {
    pIVar3 = Ivy_ObjFanin0(pObj);
    Ivy_ManResetLevels_rec(pIVar3);
    pIVar3 = Ivy_ObjFanin1(pObj);
    Ivy_ManResetLevels_rec(pIVar3);
    uVar2 = Ivy_ObjLevelNew(pObj);
    *(uint *)&pObj->field_0x8 = *(uint *)&pObj->field_0x8 & 0x7ff | (uVar2 & 0x1fffff) << 0xb;
    return uVar2 & 0x1fffff;
  }
  __assert_fail("Ivy_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyUtil.c"
                ,0x113,"int Ivy_ManResetLevels_rec(Ivy_Obj_t *)");
}

Assistant:

int Ivy_ManResetLevels_rec( Ivy_Obj_t * pObj )
{
    if ( pObj->Level || Ivy_ObjIsCi(pObj) || Ivy_ObjIsConst1(pObj) )
        return pObj->Level;
    if ( Ivy_ObjIsBuf(pObj) )
        return pObj->Level = Ivy_ManResetLevels_rec( Ivy_ObjFanin0(pObj) );
    assert( Ivy_ObjIsNode(pObj) );
    Ivy_ManResetLevels_rec( Ivy_ObjFanin0(pObj) );
    Ivy_ManResetLevels_rec( Ivy_ObjFanin1(pObj) );
    return pObj->Level = Ivy_ObjLevelNew( pObj );
}